

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
IsSubSymbol(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *sub_symbol,
           string *super_symbol)

{
  __type _Var1;
  bool bVar2;
  
  _Var1 = std::operator==(sub_symbol,super_symbol);
  bVar2 = true;
  if (!_Var1) {
    bVar2 = HasPrefixString(super_symbol,sub_symbol);
    if (bVar2) {
      bVar2 = (super_symbol->_M_dataplus)._M_p[sub_symbol->_M_string_length] == '.';
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::IsSubSymbol(
    const std::string& sub_symbol, const std::string& super_symbol) {
  return sub_symbol == super_symbol ||
         (HasPrefixString(super_symbol, sub_symbol) &&
          super_symbol[sub_symbol.size()] == '.');
}